

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Maze.cpp
# Opt level: O1

void __thiscall Maze::pathBetweenCells(Maze *this)

{
  iterator *piVar1;
  pointer pvVar2;
  pointer pvVar3;
  long lVar4;
  _Tuple_impl<0UL,_int,_int> *p_Var5;
  _Tuple_impl<0UL,_int,_int> in_RAX;
  _Elt_pointer ptVar6;
  _Tuple_impl<0UL,_int,_int> *p_Var7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  reference rVar12;
  tuple<int,_int> successorIndex;
  undefined1 local_38 [8];
  
  local_38 = (undefined1  [8])in_RAX;
  startCellEndCells(this);
  uVar9 = (ulong)(this->startCell).super__Tuple_impl<0UL,_int,_int>.
                 super__Head_base<0UL,_int,_false>._M_head_impl;
  pvVar2 = (this->used).
           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((long)(this->used).
                 super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
          -0x3333333333333333;
  if (uVar9 <= uVar8 && uVar8 - uVar9 != 0) {
    uVar10 = (ulong)(this->startCell).super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
                    super__Head_base<1UL,_int,_false>._M_head_impl;
    rVar12 = std::vector<bool,_std::allocator<bool>_>::at(pvVar2 + uVar9,uVar10);
    *rVar12._M_p = *rVar12._M_p | rVar12._M_mask;
    pvVar3 = (this->solvedMatrix).
             super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = ((long)(this->solvedMatrix).
                   super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
            -0x5555555555555555;
    if ((uVar9 <= uVar8 && uVar8 - uVar9 != 0) &&
       (lVar4 = *(long *)&pvVar3[uVar9].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data, pvVar3 = pvVar3 + uVar9, uVar9 = uVar10,
       uVar10 < (ulong)((long)*(pointer *)
                               ((long)&(pvVar3->super__Vector_base<char,_std::allocator<char>_>).
                                       _M_impl.super__Vector_impl_data + 8) - lVar4))) {
      *(undefined1 *)(lVar4 + uVar10) = 0x20;
      p_Var5 = &((this->pathStack).c.
                 super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur)->super__Tuple_impl<0UL,_int,_int>;
      if (p_Var5 == &(this->pathStack).c.
                     super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_last[-1].
                     super__Tuple_impl<0UL,_int,_int>) {
        std::deque<std::tuple<int,int>,std::allocator<std::tuple<int,int>>>::
        _M_push_back_aux<std::tuple<int,int>const&>
                  ((deque<std::tuple<int,int>,std::allocator<std::tuple<int,int>>> *)this,
                   &this->startCell);
      }
      else {
        *p_Var5 = (this->startCell).super__Tuple_impl<0UL,_int,_int>;
        piVar1 = &(this->pathStack).c.
                  super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
                  _M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      ptVar6 = (this->pathStack).c.
               super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ptVar6 != (this->pathStack).c.
                    super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          if (ptVar6 == (this->pathStack).c.
                        super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ptVar6 = (this->pathStack).c.
                     super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          adjacentCells((Maze *)local_38,(int)this,
                        ptVar6[-1].super__Tuple_impl<0UL,_int,_int>.
                        super__Head_base<0UL,_int,_false>._M_head_impl);
          p_Var5 = &((this->pathStack).c.
                     super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur)->
                    super__Tuple_impl<0UL,_int,_int>;
          ptVar6 = (this->pathStack).c.
                   super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_first;
          p_Var7 = p_Var5;
          if (p_Var5 == &ptVar6->super__Tuple_impl<0UL,_int,_int>) {
            p_Var7 = &(this->pathStack).c.
                      super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x40].
                      super__Tuple_impl<0UL,_int,_int>;
          }
          uVar11 = (ulong)(int)local_38._4_4_;
          uVar10 = (ulong)(int)local_38._0_4_;
          uVar8 = (ulong)((_Elt_pointer)p_Var7)[-1].super__Tuple_impl<0UL,_int,_int>.
                         super__Head_base<0UL,_int,_false>._M_head_impl;
          p_Var7 = p_Var5;
          if (p_Var5 == &ptVar6->super__Tuple_impl<0UL,_int,_int>) {
            p_Var7 = &(this->pathStack).c.
                      super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x40].
                      super__Tuple_impl<0UL,_int,_int>;
          }
          if (local_38._4_4_ == -1) {
            pvVar3 = (this->solvedMatrix).
                     super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar10 = ((long)(this->solvedMatrix).
                            super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
                     -0x5555555555555555;
            uVar9 = uVar8;
            if (uVar10 < uVar8 || uVar10 - uVar8 == 0) goto LAB_00102e03;
            uVar9 = (ulong)((_Elt_pointer)p_Var7)[-1].super__Tuple_impl<0UL,_int,_int>.
                           super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                           _M_head_impl;
            lVar4 = *(long *)&pvVar3[uVar8].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data;
            if ((ulong)((long)*(pointer *)
                               ((long)&pvVar3[uVar8].super__Vector_base<char,_std::allocator<char>_>
                                       ._M_impl.super__Vector_impl_data + 8) - lVar4) <= uVar9)
            goto LAB_00102e03;
            *(undefined1 *)(lVar4 + uVar9) = 0x30;
            std::deque<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::pop_back
                      ((deque<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *)this);
          }
          else {
            if (p_Var5 == &(this->pathStack).c.
                           super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_last[-1].
                           super__Tuple_impl<0UL,_int,_int>) {
              std::deque<std::tuple<int,int>,std::allocator<std::tuple<int,int>>>::
              _M_push_back_aux<std::tuple<int,int>const&>
                        ((deque<std::tuple<int,int>,std::allocator<std::tuple<int,int>>> *)this,
                         (tuple<int,_int> *)local_38);
            }
            else {
              p_Var5->super__Tuple_impl<1UL,_int> = (_Tuple_impl<1UL,_int>)local_38._0_4_;
              p_Var5->super__Head_base<0UL,_int,_false> =
                   (_Head_base<0UL,_int,_false>)local_38._4_4_;
              piVar1 = &(this->pathStack).c.
                        super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish;
              piVar1->_M_cur = piVar1->_M_cur + 1;
            }
            pvVar3 = (this->solvedMatrix).
                     super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar8 = ((long)(this->solvedMatrix).
                           super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
                    -0x5555555555555555;
            uVar9 = uVar11;
            if ((uVar8 < uVar11 || uVar8 - uVar11 == 0) ||
               (lVar4 = *(long *)&pvVar3[uVar11].super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data, uVar9 = uVar10,
               (ulong)((long)*(pointer *)
                              ((long)&pvVar3[uVar11].super__Vector_base<char,_std::allocator<char>_>
                                      ._M_impl.super__Vector_impl_data + 8) - lVar4) <= uVar10))
            goto LAB_00102e03;
            *(undefined1 *)(lVar4 + uVar10) = 0x20;
            pvVar2 = (this->used).
                     super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar8 = ((long)(this->used).
                           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
                    -0x3333333333333333;
            uVar9 = uVar11;
            if (uVar8 < uVar11 || uVar8 - uVar11 == 0) goto LAB_00102e03;
            rVar12 = std::vector<bool,_std::allocator<bool>_>::at(pvVar2 + uVar11,uVar10);
            *rVar12._M_p = *rVar12._M_p | rVar12._M_mask;
          }
          ptVar6 = (this->pathStack).c.
                   super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (ptVar6 == (this->pathStack).c.
                        super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Error: their is no path",0x17);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
            std::ostream::put(-0x48);
            std::ostream::flush();
            return;
          }
          if (ptVar6 == (this->pathStack).c.
                        super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ptVar6 = (this->pathStack).c.
                     super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          if ((ptVar6[-1].super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>.
               _M_head_impl ==
               (this->endCell).super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>.
               _M_head_impl) &&
             (ptVar6[-1].super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
              super__Head_base<1UL,_int,_false>._M_head_impl ==
              (this->endCell).super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
              super__Head_base<1UL,_int,_false>._M_head_impl)) {
            this->isSolved = true;
            printSolved(this);
            return;
          }
          ptVar6 = (this->pathStack).c.
                   super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_cur;
        } while (ptVar6 != (this->pathStack).c.
                           super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_cur);
      }
      return;
    }
  }
LAB_00102e03:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
}

Assistant:

void Maze::pathBetweenCells() {
    //generates a path between the cells, and shows the path with spaces in the solvedMatrix.
    startCellEndCells();
    int row = std::get<0>(startCell);
    int column = std::get<1>(startCell);
    used.at(row).at(column) = true;
    //MARK START AS SOLVED
    solvedMatrix.at(row).at(column) = ' ';
    pathStack.push(startCell);
    while(!pathStack.empty()){
        auto successorIndex = adjacentCells(std::get<0>(pathStack.top()),std::get<1>(pathStack.top()));
        row = std::get<0>(successorIndex);
        column =std::get<1>(successorIndex);

        int topOfStackRow = std::get<0>(pathStack.top());
        int topOfStackColumn = std::get<1>(pathStack.top());

        if(std::get<0>(successorIndex) == -1){
            //UNMARK CURRENT CELL, as unsolved.
            //BACK TRACK
            solvedMatrix.at(topOfStackRow).at(topOfStackColumn) = '0';
            pathStack.pop();
        }
        else{
            pathStack.push(successorIndex);
            solvedMatrix.at(row).at(column) = ' ';
            used.at(row).at(column) = true;
        }
        if(pathStack.empty()){
            std::cout<<"Error: their is no path"
            <<std::endl;
            break;
        }
        if(pathStack.top() == endCell){
            isSolved = true;
            printSolved();
            break;
        }
    }
}